

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter_11.cpp
# Opt level: O0

string * prompt(string *__return_storage_ptr__,string *msg)

{
  ostream *poVar1;
  string *msg_local;
  string *line;
  
  poVar1 = std::operator<<((ostream *)&std::cout,(string *)msg);
  std::operator<<(poVar1,": ");
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string prompt(const std::string& msg)
{
	std::cout << msg << ": ";
	std::string line;
	std::getline(std::cin, line);
	return line;
}